

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_IncorrectConstructionDuplicateExcludes_Test::TestBody
          (TApp_IncorrectConstructionDuplicateExcludes_Test *this)

{
  bool bVar1;
  Option *this_00;
  Option *opt;
  App *this_01;
  AssertHelper AStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"--cat",(allocator *)&local_a0);
  std::__cxx11::string::string((string *)&local_58,"",(allocator *)&AStack_a8);
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_flag(this_01,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_78,"--other",(allocator *)&local_a0);
  std::__cxx11::string::string((string *)&local_98,"",(allocator *)&AStack_a8);
  opt = CLI::App::add_flag(this_01,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::excludes(this_00,opt);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::excludes(this_00,opt);
    }
    testing::Message::Message((Message *)&local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc2,
               "Expected: cat->excludes(other) throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
  }
  else {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc1,
               "Expected: cat->excludes(other) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_a0);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateExcludes) {
    auto cat = app.add_flag("--cat");
    auto other = app.add_flag("--other");
    ASSERT_NO_THROW(cat->excludes(other));
    EXPECT_THROW(cat->excludes(other), CLI::OptionAlreadyAdded);
}